

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

bignum __thiscall jbcoin::makeHash(jbcoin *this,Blob *pubGen,int seq,bignum *order)

{
  undefined4 v;
  bool bVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  iterator pvVar3;
  pointer dest;
  pointer pvVar4;
  size_t sVar5;
  array<unsigned_char,_41UL> *args;
  bool local_d2;
  undefined1 local_94 [8];
  result_type root;
  undefined1 local_56 [8];
  array<unsigned_char,_41UL> buf;
  int subSeq;
  bignum *order_local;
  int seq_local;
  Blob *pubGen_local;
  bignum *result;
  
  buf._M_elems[0x22] = '\0';
  buf._M_elems[0x23] = '\0';
  buf._M_elems[0x24] = '\0';
  buf._M_elems[0x25] = '\0';
  buf._M_elems[0x21] = '\0';
  unique0x10000201 = order;
  openssl::bignum::bignum((bignum *)this);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pubGen);
  if (sVar2 == 0x21) {
    do {
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pubGen);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pubGen);
      pvVar3 = std::array<unsigned_char,_41UL>::begin((array<unsigned_char,_41UL> *)local_56);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current,pvVar3);
      pvVar3 = std::array<unsigned_char,_41UL>::begin((array<unsigned_char,_41UL> *)local_56);
      copy_uint32<unsigned_char*>(pvVar3 + 0x21,seq);
      pvVar3 = std::array<unsigned_char,_41UL>::begin((array<unsigned_char,_41UL> *)local_56);
      v = buf._M_elems._34_4_;
      buf._M_elems._34_4_ = buf._M_elems._34_4_ + 1;
      copy_uint32<unsigned_char*>(pvVar3 + 0x25,v);
      sha512Half_s<std::array<unsigned_char,41ul>>((result_type *)local_94,(jbcoin *)local_56,args);
      dest = std::array<unsigned_char,_41UL>::data((array<unsigned_char,_41UL> *)local_56);
      sVar2 = std::array<unsigned_char,_41UL>::size((array<unsigned_char,_41UL> *)local_56);
      beast::secure_erase<void>(dest,sVar2);
      pvVar4 = base_uint<256UL,_void>::data((base_uint<256UL,_void> *)local_94);
      sVar5 = base_uint<256UL,_void>::size();
      openssl::bignum::assign((bignum *)this,pvVar4,sVar5);
      pvVar4 = base_uint<256UL,_void>::data((base_uint<256UL,_void> *)local_94);
      sVar5 = base_uint<256UL,_void>::size();
      beast::secure_erase<void>(pvVar4,sVar5);
      bVar1 = openssl::bignum::is_zero((bignum *)this);
      local_d2 = true;
      if (!bVar1) {
        local_d2 = openssl::operator>=((bignum *)this,stack0xffffffffffffffd8);
      }
    } while (local_d2 != false);
    return (bignum)(BIGNUM *)this;
  }
  __assert_fail("pubGen.size() == 33",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/crypto/impl/GenerateDeterministicKey.cpp"
                ,0x91,"bignum jbcoin::makeHash(const Blob &, int, const bignum &)");
}

Assistant:

static bignum makeHash (Blob const& pubGen, int seq, bignum const& order)
{
    int subSeq = 0;

    bignum result;

    assert(pubGen.size() == 33);
    do
    {
        // buf: 0          pubGen             33 seq   37 subSeq  41
        //      |<--------------------------->|<------>|<-------->|
        std::array<std::uint8_t, 41> buf;
        std::copy (pubGen.begin(), pubGen.end(), buf.begin());
        copy_uint32 (buf.begin() + 33, seq);
        copy_uint32 (buf.begin() + 37, subSeq++);
        auto root = sha512Half_s(buf);
        beast::secure_erase(buf.data(), buf.size());
        result.assign (root.data(), root.size());
        beast::secure_erase(root.data(), root.size());
    }
    while (result.is_zero()  ||  result >= order);

    return result;
}